

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBuildNameCommand.cxx
# Opt level: O3

bool cmBuildNameCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *args,cmExecutionStatus *status)

{
  char *pcVar1;
  string *name;
  string *psVar2;
  cmMakefile *this;
  pointer pcVar3;
  bool bVar4;
  cmValue cVar5;
  long *plVar6;
  undefined8 *puVar7;
  size_type sVar8;
  ulong *puVar9;
  ulong uVar10;
  _Alloc_hider _Var11;
  string buildname;
  string RegExp;
  string compiler;
  string local_1c0;
  string local_1a0;
  ulong *local_180;
  long local_178;
  ulong local_170;
  undefined4 uStack_168;
  undefined4 uStack_164;
  undefined1 *local_160;
  long local_158;
  undefined1 local_150;
  undefined7 uStack_14f;
  long *local_140;
  undefined8 local_138;
  long local_130;
  undefined8 uStack_128;
  undefined1 *local_120;
  undefined8 local_118;
  undefined1 local_110;
  undefined7 uStack_10f;
  undefined1 local_100 [88];
  char *local_a8;
  char *local_a0;
  char *local_50;
  char *local_40;
  int local_38;
  
  name = (args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (name == psVar2) {
    local_100._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_100 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_100,"called with incorrect number of arguments","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    _Var11._M_p = (pointer)local_100._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_100 + 0x10)) goto LAB_001aa55b;
  }
  else {
    this = status->Makefile;
    cVar5 = cmMakefile::GetDefinition(this,name);
    if (cVar5.Value != (string *)0x0) {
      local_50 = (char *)0x0;
      local_40 = (char *)0x0;
      local_38 = 0;
      memset((RegularExpression *)local_100,0,0xaa);
      cmsys::RegularExpression::compile((RegularExpression *)local_100,"[()/]");
      pcVar3 = ((cVar5.Value)->_M_dataplus)._M_p;
      local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1c0,pcVar3,pcVar3 + (cVar5.Value)->_M_string_length);
      bVar4 = cmsys::RegularExpression::find
                        ((RegularExpression *)local_100,local_1c0._M_dataplus._M_p,
                         (RegularExpressionMatch *)local_100);
      if (bVar4) {
        if (local_1c0._M_string_length != 0) {
          sVar8 = 0;
          do {
            if (local_1c0._M_dataplus._M_p[sVar8] == '/') {
              local_1c0._M_dataplus._M_p[sVar8] = '_';
            }
            sVar8 = sVar8 + 1;
          } while (local_1c0._M_string_length != sVar8);
          if (local_1c0._M_string_length != 0) {
            sVar8 = 0;
            do {
              if (local_1c0._M_dataplus._M_p[sVar8] == '(') {
                local_1c0._M_dataplus._M_p[sVar8] = '_';
              }
              sVar8 = sVar8 + 1;
            } while (local_1c0._M_string_length != sVar8);
            if (local_1c0._M_string_length != 0) {
              sVar8 = 0;
              do {
                if (local_1c0._M_dataplus._M_p[sVar8] == ')') {
                  local_1c0._M_dataplus._M_p[sVar8] = '_';
                }
                sVar8 = sVar8 + 1;
              } while (local_1c0._M_string_length != sVar8);
            }
          }
        }
        cmMakefile::AddCacheDefinition
                  (this,(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start,local_1c0._M_dataplus._M_p,
                   "Name of build.",STRING,false);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
        operator_delete(local_1c0._M_dataplus._M_p,
                        (ulong)(local_1c0.field_2._M_allocated_capacity + 1));
      }
      if (local_40 != (char *)0x0) {
        operator_delete__(local_40);
      }
      goto LAB_001aa55b;
    }
    local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"WinNT","");
    pcVar1 = local_100 + 0x10;
    local_100._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"UNIX","");
    cVar5 = cmMakefile::GetDefinition(this,(string *)local_100);
    if ((char *)local_100._0_8_ != pcVar1) {
      operator_delete((void *)local_100._0_8_,(ulong)(local_100._16_8_ + 1));
    }
    if (cVar5.Value != (string *)0x0) {
      local_1c0._M_string_length = 0;
      *local_1c0._M_dataplus._M_p = '\0';
      local_100._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"uname -a","");
      cmSystemTools::RunSingleCommand
                ((string *)local_100,&local_1c0,&local_1c0,(int *)0x0,(char *)0x0,OUTPUT_MERGE,
                 (cmDuration)0x0);
      if ((char *)local_100._0_8_ != pcVar1) {
        operator_delete((void *)local_100._0_8_,(ulong)(local_100._16_8_ + 1));
      }
      if (local_1c0._M_string_length != 0) {
        local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1a0,"([^ ]*) [^ ]* ([^ ]*) ","");
        local_50 = (char *)0x0;
        local_40 = (char *)0x0;
        local_38 = 0;
        memset((RegularExpression *)local_100,0,0xaa);
        cmsys::RegularExpression::compile((RegularExpression *)local_100,local_1a0._M_dataplus._M_p)
        ;
        bVar4 = cmsys::RegularExpression::find
                          ((RegularExpression *)local_100,local_1c0._M_dataplus._M_p,
                           (RegularExpressionMatch *)local_100);
        if (bVar4) {
          local_120 = &local_110;
          if ((char *)local_100._8_8_ == (char *)0x0) {
            local_118 = 0;
            local_110 = 0;
          }
          else {
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_120,local_100._8_8_,local_a8);
          }
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_120);
          puVar9 = (ulong *)(plVar6 + 2);
          if ((ulong *)*plVar6 == puVar9) {
            local_170 = *puVar9;
            uStack_168 = (undefined4)plVar6[3];
            uStack_164 = *(undefined4 *)((long)plVar6 + 0x1c);
            local_180 = &local_170;
          }
          else {
            local_170 = *puVar9;
            local_180 = (ulong *)*plVar6;
          }
          local_178 = plVar6[1];
          *plVar6 = (long)puVar9;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          if ((char *)local_100._16_8_ == (char *)0x0) {
            local_160 = &local_150;
            local_158 = 0;
            local_150 = 0;
          }
          else {
            local_160 = &local_150;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_160,local_100._16_8_,local_a0);
          }
          uVar10 = 0xf;
          if (local_180 != &local_170) {
            uVar10 = local_170;
          }
          if (uVar10 < (ulong)(local_158 + local_178)) {
            uVar10 = 0xf;
            if (local_160 != &local_150) {
              uVar10 = CONCAT71(uStack_14f,local_150);
            }
            if (uVar10 < (ulong)(local_158 + local_178)) goto LAB_001aa2e9;
            puVar7 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_160,0,(char *)0x0,(ulong)local_180)
            ;
          }
          else {
LAB_001aa2e9:
            puVar7 = (undefined8 *)
                     std::__cxx11::string::_M_append((char *)&local_180,(ulong)local_160);
          }
          local_140 = &local_130;
          plVar6 = puVar7 + 2;
          if ((long *)*puVar7 == plVar6) {
            local_130 = *plVar6;
            uStack_128 = puVar7[3];
          }
          else {
            local_130 = *plVar6;
            local_140 = (long *)*puVar7;
          }
          local_138 = puVar7[1];
          *puVar7 = plVar6;
          puVar7[1] = 0;
          *(undefined1 *)plVar6 = 0;
          std::__cxx11::string::operator=((string *)&local_1c0,(string *)&local_140);
          if (local_140 != &local_130) {
            operator_delete(local_140,local_130 + 1);
          }
          if (local_160 != &local_150) {
            operator_delete(local_160,CONCAT71(uStack_14f,local_150) + 1);
          }
          if (local_180 != &local_170) {
            operator_delete(local_180,local_170 + 1);
          }
          if (local_120 != &local_110) {
            operator_delete(local_120,CONCAT71(uStack_10f,local_110) + 1);
          }
        }
        if (local_40 != (char *)0x0) {
          operator_delete__(local_40);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
          operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
        }
      }
    }
    local_100._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_100 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"${CMAKE_CXX_COMPILER}","");
    cmMakefile::ExpandVariablesInString(this,(string *)local_100);
    std::__cxx11::string::append((char *)&local_1c0);
    cmsys::SystemTools::GetFilenameName(&local_1a0,(string *)local_100);
    std::__cxx11::string::_M_append((char *)&local_1c0,(ulong)local_1a0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
      operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
    }
    if (local_1c0._M_string_length != 0) {
      sVar8 = 0;
      do {
        if (local_1c0._M_dataplus._M_p[sVar8] == '/') {
          local_1c0._M_dataplus._M_p[sVar8] = '_';
        }
        sVar8 = sVar8 + 1;
      } while (local_1c0._M_string_length != sVar8);
      if (local_1c0._M_string_length != 0) {
        sVar8 = 0;
        do {
          if (local_1c0._M_dataplus._M_p[sVar8] == '(') {
            local_1c0._M_dataplus._M_p[sVar8] = '_';
          }
          sVar8 = sVar8 + 1;
        } while (local_1c0._M_string_length != sVar8);
        if (local_1c0._M_string_length != 0) {
          sVar8 = 0;
          do {
            if (local_1c0._M_dataplus._M_p[sVar8] == ')') {
              local_1c0._M_dataplus._M_p[sVar8] = '_';
            }
            sVar8 = sVar8 + 1;
          } while (local_1c0._M_string_length != sVar8);
        }
      }
    }
    cmMakefile::AddCacheDefinition
              (this,(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start,local_1c0._M_dataplus._M_p,
               "Name of build.",STRING,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_100 + 0x10)) {
      operator_delete((void *)local_100._0_8_,(ulong)(local_100._16_8_ + 1));
    }
    local_100._16_8_ = local_1c0.field_2._M_allocated_capacity;
    _Var11._M_p = local_1c0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p == &local_1c0.field_2) goto LAB_001aa55b;
  }
  operator_delete(_Var11._M_p,(ulong)(local_100._16_8_ + 1));
LAB_001aa55b:
  return name != psVar2;
}

Assistant:

bool cmBuildNameCommand(std::vector<std::string> const& args,
                        cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }
  cmMakefile& mf = status.GetMakefile();
  cmValue cacheValue = mf.GetDefinition(args[0]);
  if (cacheValue) {
    // do we need to correct the value?
    cmsys::RegularExpression reg("[()/]");
    std::string cv = *cacheValue;
    if (reg.find(cv)) {
      std::replace(cv.begin(), cv.end(), '/', '_');
      std::replace(cv.begin(), cv.end(), '(', '_');
      std::replace(cv.begin(), cv.end(), ')', '_');
      mf.AddCacheDefinition(args[0], cv, "Name of build.",
                            cmStateEnums::STRING);
    }
    return true;
  }

  std::string buildname = "WinNT";
  if (mf.GetDefinition("UNIX")) {
    buildname.clear();
    cmSystemTools::RunSingleCommand("uname -a", &buildname, &buildname);
    if (!buildname.empty()) {
      std::string RegExp = "([^ ]*) [^ ]* ([^ ]*) ";
      cmsys::RegularExpression reg(RegExp);
      if (reg.find(buildname)) {
        buildname = reg.match(1) + "-" + reg.match(2);
      }
    }
  }
  std::string compiler = "${CMAKE_CXX_COMPILER}";
  mf.ExpandVariablesInString(compiler);
  buildname += "-";
  buildname += cmSystemTools::GetFilenameName(compiler);
  std::replace(buildname.begin(), buildname.end(), '/', '_');
  std::replace(buildname.begin(), buildname.end(), '(', '_');
  std::replace(buildname.begin(), buildname.end(), ')', '_');

  mf.AddCacheDefinition(args[0], buildname, "Name of build.",
                        cmStateEnums::STRING);
  return true;
}